

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *
__thiscall wallet::LegacyDataSPKM::GetNotMineScriptPubKeys(LegacyDataSPKM *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  reference pCVar4;
  long *in_RSI;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<CScript,_true,_true>,_bool> pVar5;
  CScript *script;
  WatchOnlySet *__range1;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *spks;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock50;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  _Node_iterator_base<CScript,_true> in_stack_ffffffffffffff68;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *pszName
  ;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszName = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(char *)pszName,(char *)in_RSI,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>::
  unordered_set(in_stack_ffffffffffffff58);
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::begin
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::end
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff68._M_cur,
                                 (_Self *)CONCAT17(in_stack_ffffffffffffff67,
                                                   in_stack_ffffffffffffff60)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pCVar4 = std::_Rb_tree_const_iterator<CScript>::operator*
                       ((_Rb_tree_const_iterator<CScript> *)in_stack_ffffffffffffff58);
    iVar3 = (**(code **)(*in_RSI + 0x18))(in_RSI,pCVar4);
    if (iVar3 == 0) {
      pVar5 = std::
              unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
              ::insert((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                        *)in_stack_ffffffffffffff68._M_cur,
                       (value_type *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      in_stack_ffffffffffffff68._M_cur =
           (__node_type *)pVar5.first.super__Node_iterator_base<CScript,_true>._M_cur;
      in_stack_ffffffffffffff67 = pVar5.second;
    }
    std::_Rb_tree_const_iterator<CScript>::operator++
              ((_Rb_tree_const_iterator<CScript> *)in_stack_ffffffffffffff58);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::unordered_set<CScript, SaltedSipHasher> LegacyDataSPKM::GetNotMineScriptPubKeys() const
{
    LOCK(cs_KeyStore);
    std::unordered_set<CScript, SaltedSipHasher> spks;
    for (const CScript& script : setWatchOnly) {
        if (IsMine(script) == ISMINE_NO) spks.insert(script);
    }
    return spks;
}